

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

void __thiscall
arangodb::velocypack::Builder::Builder
          (Builder *this,shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_> *buffer,
          Options *opts)

{
  char *msg;
  shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_> *in_RDX;
  Builder *in_RSI;
  long in_RDI;
  shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_> *in_stack_ffffffffffffffa8;
  shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_> *in_stack_ffffffffffffffb0;
  Exception *this_00;
  
  this_00 = (Exception *)&stack0xffffffffffffffd8;
  std::shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_>::shared_ptr
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  Builder(in_RSI,in_RDX);
  std::shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_>::~shared_ptr
            ((shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_> *)0x106b87);
  if (in_RDX != (shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_> *)0x0) {
    *(shared_ptr<arangodb::velocypack::Buffer<unsigned_char>_> **)(in_RDI + 0xb0) = in_RDX;
    return;
  }
  msg = (char *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,(ExceptionType)((ulong)in_RDI >> 0x20),msg);
  __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

Builder::Builder(std::shared_ptr<Buffer<uint8_t>> buffer, Options const* opts)
    : Builder(std::move(buffer)) {
  if (VELOCYPACK_UNLIKELY(opts == nullptr)) {
    throw Exception(Exception::InternalError, "Options cannot be a nullptr");
  }
  options = opts;
}